

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

char * __thiscall
MeCab::anon_unknown_0::LatticeImpl::toStringInternal(LatticeImpl *this,StringBuffer *os)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  char *pcVar2;
  
  os->size_ = 0;
  if (this->writer_ == (Writer *)0x0) {
    anon_unknown_3::writeLattice(&this->super_Lattice,os);
    __buf = extraout_RDX_00;
  }
  else {
    sVar1 = Writer::write(this->writer_,(int)this,os,in_RCX);
    __buf = extraout_RDX;
    if ((char)sVar1 == '\0') {
      return (char *)0x0;
    }
  }
  pcVar2 = (char *)0x0;
  StringBuffer::write(os,0,__buf,in_RCX);
  if (os->error_ == false) {
    pcVar2 = os->ptr_;
  }
  if (pcVar2 == (char *)0x0) {
    (*(this->super_Lattice)._vptr_Lattice[0x25])(this,"output buffer overflow");
    return (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char *LatticeImpl::toStringInternal(StringBuffer *os) {
  os->clear();
  if (writer_) {
    if (!writer_->write(this, os)) {
      return 0;
    }
  } else {
    writeLattice(this, os);
  }
  *os << '\0';
  if (!os->str()) {
    set_what("output buffer overflow");
    return 0;
  }
  return os->str();
}